

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatc.cpp
# Opt level: O0

void __thiscall
flatbuffers::FlatCompiler::LoadBinarySchema
          (FlatCompiler *this,Parser *parser,string *filename,string *contents)

{
  bool bVar1;
  uint8_t *buf;
  size_t size;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string *local_28;
  string *contents_local;
  string *filename_local;
  Parser *parser_local;
  FlatCompiler *this_local;
  
  local_28 = contents;
  contents_local = filename;
  filename_local = (string *)parser;
  parser_local = (Parser *)this;
  buf = (uint8_t *)std::__cxx11::string::c_str();
  size = std::__cxx11::string::size();
  bVar1 = Parser::Deserialize(parser,buf,size);
  if (!bVar1) {
    std::operator+(&local_48,"failed to load binary schema: ",contents_local);
    Error(this,&local_48,false,false);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return;
}

Assistant:

void FlatCompiler::LoadBinarySchema(flatbuffers::Parser &parser,
                                    const std::string &filename,
                                    const std::string &contents) {
  if (!parser.Deserialize(reinterpret_cast<const uint8_t *>(contents.c_str()),
                          contents.size())) {
    Error("failed to load binary schema: " + filename, false, false);
  }
}